

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::RenderDragDropTargetRect(ImRect *bb,ImRect *item_clip_rect)

{
  ImGuiWindow *pIVar1;
  ImDrawList *this;
  bool bVar2;
  ImU32 col;
  ImRect local_38;
  
  pIVar1 = GImGui->CurrentWindow;
  local_38.Min = bb->Min;
  local_38.Max = bb->Max;
  ImRect::ClipWith(&local_38,item_clip_rect);
  local_38.Min.y = local_38.Min.y + -3.5;
  local_38.Min.x = local_38.Min.x + -3.5;
  local_38.Max.y = local_38.Max.y + 3.5;
  local_38.Max.x = local_38.Max.x + 3.5;
  bVar2 = ImRect::Contains(&pIVar1->ClipRect,&local_38);
  if (!bVar2) {
    ImDrawList::PushClipRectFullScreen(pIVar1->DrawList);
  }
  this = pIVar1->DrawList;
  col = GetColorU32(0x33,1.0);
  ImDrawList::AddRect(this,&local_38.Min,&local_38.Max,col,0.0,0,2.0);
  if (!bVar2) {
    ImDrawList::PopClipRect(pIVar1->DrawList);
  }
  return;
}

Assistant:

void ImGui::RenderDragDropTargetRect(const ImRect& bb, const ImRect& item_clip_rect)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImRect bb_display = bb;
    bb_display.ClipWith(item_clip_rect); // Clip THEN expand so we have a way to visualize that target is not entirely visible.
    bb_display.Expand(3.5f);
    bool push_clip_rect = !window->ClipRect.Contains(bb_display);
    if (push_clip_rect)
        window->DrawList->PushClipRectFullScreen();
    window->DrawList->AddRect(bb_display.Min, bb_display.Max, GetColorU32(ImGuiCol_DragDropTarget), 0.0f, 0, 2.0f);
    if (push_clip_rect)
        window->DrawList->PopClipRect();
}